

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O2

idx_t __thiscall
duckdb::BufferPool::PurgeAgedBlocksInternal
          (BufferPool *this,EvictionQueue *queue,uint32_t max_age_sec,int64_t now,int64_t limit)

{
  unique_lock<std::mutex> *this_00;
  long lVar1;
  bool bVar2;
  bool bVar3;
  BlockHandle *pBVar4;
  type handle_p;
  BufferEvictionNode node;
  shared_ptr<duckdb::BlockHandle,_true> handle;
  BlockLock lock;
  idx_t local_90;
  BufferEvictionNode local_88;
  int64_t local_68;
  int64_t local_60;
  __int_type local_58;
  undefined1 local_50 [32];
  
  local_90 = 0;
  this_00 = (unique_lock<std::mutex> *)(local_50 + 0x10);
  local_68 = now;
  local_60 = limit;
  do {
    while( true ) {
      local_88.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_88.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar3 = duckdb_moodycamel::
              ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
              ::try_dequeue<duckdb::BufferEvictionNode>(&queue->q,&local_88);
      if ((!bVar3) && (bVar3 = EvictionQueue::TryDequeueWithLock(queue,&local_88), !bVar3)) {
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  (&local_88.handle.internal.
                    super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        return local_90;
      }
      BufferEvictionNode::TryGetBlockHandle((BufferEvictionNode *)local_50);
      if ((element_type *)local_50._0_8_ != (element_type *)0x0) break;
      LOCK();
      (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
           (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
LAB_004918bb:
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                (&local_88.handle.internal.
                  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    pBVar4 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                       ((shared_ptr<duckdb::BlockHandle,_true> *)local_50);
    ::std::unique_lock<std::mutex>::unique_lock(this_00,&pBVar4->lock);
    handle_p = shared_ptr<duckdb::BlockHandle,_true>::operator*
                         ((shared_ptr<duckdb::BlockHandle,_true> *)local_50);
    bVar3 = BufferEvictionNode::CanUnload(&local_88,handle_p);
    if (!bVar3) {
      LOCK();
      (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
           (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      ::std::unique_lock<std::mutex>::~unique_lock(this_00);
      goto LAB_004918bb;
    }
    pBVar4 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                       ((shared_ptr<duckdb::BlockHandle,_true> *)local_50);
    lVar1 = (pBVar4->lru_timestamp_msec).super___atomic_base<long>._M_i;
    bVar3 = local_60 <= lVar1;
    bVar2 = lVar1 <= local_68;
    pBVar4 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                       ((shared_ptr<duckdb::BlockHandle,_true> *)local_50);
    local_58 = (pBVar4->memory_usage).super___atomic_base<unsigned_long>._M_i;
    pBVar4 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                       ((shared_ptr<duckdb::BlockHandle,_true> *)local_50);
    BlockHandle::Unload(pBVar4,(BlockLock *)handle_p);
    local_90 = local_90 + local_58;
    ::std::unique_lock<std::mutex>::~unique_lock(this_00);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&local_88.handle.internal.
                super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar3 && bVar2) {
      return local_90;
    }
  } while( true );
}

Assistant:

idx_t BufferPool::PurgeAgedBlocksInternal(EvictionQueue &queue, uint32_t max_age_sec, int64_t now, int64_t limit) {
	idx_t purged_bytes = 0;
	queue.IterateUnloadableBlocks(
	    [&](BufferEvictionNode &node, const shared_ptr<BlockHandle> &handle, BlockLock &lock) {
		    // We will unload this block regardless. But stop the iteration immediately afterward if this
		    // block is younger than the age threshold.
		    auto lru_timestamp_msec = handle->GetLRUTimestamp();
		    bool is_fresh = lru_timestamp_msec >= limit && lru_timestamp_msec <= now;
		    purged_bytes += handle->GetMemoryUsage();
		    handle->Unload(lock);
		    // Return false to stop iterating if the current block is_fresh
		    return !is_fresh;
	    });
	return purged_bytes;
}